

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t *
container_andnot(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  uint8_t uVar1;
  _Bool _Var2;
  array_container_t *dst;
  void *pvVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  array_container_t *local_28;
  int iVar3;
  
  uVar5 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar5 == 4) {
    uVar5 = (uint)*(byte *)((long)c1 + 8);
    if (*(byte *)((long)c1 + 8) == 4) goto LAB_0010b4c8;
    c1 = *c1;
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    if (type2 == 4) {
LAB_0010b4c8:
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    c2 = *c2;
  }
  local_28 = (array_container_t *)0x0;
  switch((uint)type2 + (uVar5 & 0xff) * 4) {
  case 5:
    _Var2 = bitset_bitset_container_andnot
                      ((bitset_container_t *)c1,(bitset_container_t *)c2,&local_28);
    break;
  case 6:
    _Var2 = bitset_array_container_andnot
                      ((bitset_container_t *)c1,(array_container_t *)c2,&local_28);
    break;
  case 7:
    if (((((array_container_t *)c2)->cardinality == 1) && (*((array_container_t *)c2)->array == 0))
       && (((array_container_t *)c2)->array[1] == 0xffff)) {
LAB_0010b4b4:
      pvVar4 = calloc(1,0x10);
      *result_type = '\x02';
      return pvVar4;
    }
    _Var2 = bitset_run_container_andnot((bitset_container_t *)c1,(run_container_t *)c2,&local_28);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1777,
                  "container_t *container_andnot(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    dst = (array_container_t *)calloc(1,0x10);
    array_bitset_container_andnot((array_container_t *)c1,(bitset_container_t *)c2,dst);
    goto LAB_0010b472;
  case 10:
    dst = (array_container_t *)calloc(1,0x10);
    array_container_andnot((array_container_t *)c1,(array_container_t *)c2,dst);
    goto LAB_0010b472;
  case 0xb:
    if (((((array_container_t *)c2)->cardinality == 1) && (*((array_container_t *)c2)->array == 0))
       && (((array_container_t *)c2)->array[1] == 0xffff)) goto LAB_0010b4b4;
    dst = (array_container_t *)calloc(1,0x10);
    array_run_container_andnot((array_container_t *)c1,(run_container_t *)c2,dst);
LAB_0010b472:
    *result_type = '\x02';
    return dst;
  case 0xd:
    _Var2 = run_bitset_container_andnot((run_container_t *)c1,(bitset_container_t *)c2,&local_28);
    break;
  case 0xe:
    iVar3 = run_array_container_andnot((run_container_t *)c1,(array_container_t *)c2,&local_28);
    uVar1 = (uint8_t)iVar3;
    goto LAB_0010b44e;
  case 0xf:
    if (((((array_container_t *)c2)->cardinality == 1) && (*((array_container_t *)c2)->array == 0))
       && (((array_container_t *)c2)->array[1] == 0xffff)) goto LAB_0010b4b4;
    iVar3 = run_run_container_andnot((run_container_t *)c1,(run_container_t *)c2,&local_28);
    uVar1 = (uint8_t)iVar3;
LAB_0010b44e:
    *result_type = uVar1;
    return local_28;
  }
  *result_type = '\x02' - _Var2;
  return local_28;
}

Assistant:

static inline container_t *container_andnot(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_andnot(
                                const_CAST_bitset(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            result = array_container_create();
            array_array_container_andnot(const_CAST_array(c1),
                                         const_CAST_array(c2),
                                         CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = array_container_create();
                *result_type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            *result_type =
                run_run_container_andnot(const_CAST_run(c1),
                                         const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            *result_type = bitset_array_container_andnot(
                                const_CAST_bitset(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = array_container_create();
            array_bitset_container_andnot(const_CAST_array(c1),
                                          const_CAST_bitset(c2),
                                          CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = array_container_create();
                *result_type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            *result_type = bitset_run_container_andnot(
                                const_CAST_bitset(c1),
                                const_CAST_run(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_andnot(
                                const_CAST_run(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = array_container_create();
                *result_type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            result = array_container_create();
            array_run_container_andnot(const_CAST_array(c1),
                                       const_CAST_run(c2),
                                       CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            *result_type = run_array_container_andnot(
                const_CAST_run(c1), const_CAST_array(c2),
                &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}